

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void print_usage(void)

{
  long lVar1;
  long lVar2;
  
  puts("\nUsage:");
  lVar1 = 0x16e128;
  lVar2 = 0x17;
  do {
    printf("%-32s\t %s",lVar1 + -0x84,lVar1);
    lVar1 = lVar1 + 0x288;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return;
}

Assistant:

void print_usage(void)
{
    WORD32 i = 0;
    WORD32 num_entries = sizeof(argument_mapping) / sizeof(argument_t);
    printf("\nUsage:\n");
    while(i < num_entries)
    {
        printf("%-32s\t %s", argument_mapping[i].argument_name,
               argument_mapping[i].description);
        i++;
    }
}